

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

void __thiscall Js::RootObjectBase::EnsureNoProperty(RootObjectBase *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  ScriptContext *scriptContext;
  byte local_16;
  byte local_15;
  uint local_14;
  bool isNonconfigurable;
  bool isDeclared;
  RootObjectBase *pRStack_10;
  PropertyId propertyId_local;
  RootObjectBase *this_local;
  
  local_14 = propertyId;
  pRStack_10 = this;
  BVar3 = IsInternalPropertyId(propertyId);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0xd9,"(!Js::IsInternalPropertyId(propertyId))",
                                "!Js::IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_15 = 0;
  local_16 = 0;
  pDVar6 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x1f])
                    (pDVar6,this,(ulong)local_14,0,&local_15,&local_16);
  if ((iVar4 != 0) && (((local_15 & 1) != 0 || ((local_16 & 1) != 0)))) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5fbe4,(PCWSTR)0x0);
  }
  return;
}

Assistant:

void
    RootObjectBase::EnsureNoProperty(PropertyId propertyId)
    {
        Assert(!Js::IsInternalPropertyId(propertyId));
        bool isDeclared = false;
        bool isNonconfigurable = false;
        if (GetTypeHandler()->HasRootProperty(this, propertyId, nullptr, &isDeclared, &isNonconfigurable) &&
            (isDeclared || isNonconfigurable))
        {
            JavascriptError::ThrowReferenceError(this->GetScriptContext(), ERRRedeclaration);
        }
    }